

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

size_t __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
::_find_key<phmap::priv::hash_internal::EnumClass>
          (raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
           *this,EnumClass *key,size_t hashval)

{
  slot_type **ppptVar1;
  char *pcVar2;
  ulong uVar3;
  uint uVar4;
  ushort uVar5;
  ctrl_t **ppcVar6;
  raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  *prVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  *prVar13;
  bool bVar14;
  __m128i match;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  char cVar17;
  char cVar19;
  char cVar20;
  char cVar21;
  
  ppcVar6 = &this->ctrl_;
  prVar7 = (raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
            *)0xffffffffffffffff;
  if (*ppcVar6 != (ctrl_t *)0x0) {
    uVar3 = this->capacity_;
    if ((uVar3 + 1 & uVar3) != 0) {
      __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                    ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
    }
    uVar9 = hashval >> 7 & uVar3;
    auVar15 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
    auVar15 = pshuflw(auVar15,auVar15,0);
    ppptVar1 = &this->slots_;
    lVar11 = 0;
    do {
      pcVar2 = *ppcVar6 + uVar9;
      cVar17 = auVar15[0];
      auVar18[0] = -(cVar17 == *pcVar2);
      cVar19 = auVar15[1];
      auVar18[1] = -(cVar19 == pcVar2[1]);
      cVar20 = auVar15[2];
      auVar18[2] = -(cVar20 == pcVar2[2]);
      cVar21 = auVar15[3];
      auVar18[3] = -(cVar21 == pcVar2[3]);
      auVar18[4] = -(cVar17 == pcVar2[4]);
      auVar18[5] = -(cVar19 == pcVar2[5]);
      auVar18[6] = -(cVar20 == pcVar2[6]);
      auVar18[7] = -(cVar21 == pcVar2[7]);
      auVar18[8] = -(cVar17 == pcVar2[8]);
      auVar18[9] = -(cVar19 == pcVar2[9]);
      auVar18[10] = -(cVar20 == pcVar2[10]);
      auVar18[0xb] = -(cVar21 == pcVar2[0xb]);
      auVar18[0xc] = -(cVar17 == pcVar2[0xc]);
      auVar18[0xd] = -(cVar19 == pcVar2[0xd]);
      auVar18[0xe] = -(cVar20 == pcVar2[0xe]);
      auVar18[0xf] = -(cVar21 == pcVar2[0xf]);
      uVar5 = (ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe | (ushort)(auVar18[0xf] >> 7) << 0xf;
      iVar12 = 4;
      bVar14 = uVar5 == 0;
      if (!bVar14) {
        uVar8 = (uint)uVar5;
        do {
          uVar4 = 0;
          if (uVar8 != 0) {
            for (; (uVar8 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
            }
          }
          prVar13 = (raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
                     *)(uVar4 + uVar9 & uVar3);
          if ((*ppptVar1)[(long)prVar13]->first == *key) {
            iVar12 = 1;
            this = prVar13;
            break;
          }
          uVar8 = uVar8 - 1 & uVar8;
          bVar14 = uVar8 == 0;
        } while (!bVar14);
      }
      if (bVar14) {
        auVar16[0] = -(*pcVar2 == -0x80);
        auVar16[1] = -(pcVar2[1] == -0x80);
        auVar16[2] = -(pcVar2[2] == -0x80);
        auVar16[3] = -(pcVar2[3] == -0x80);
        auVar16[4] = -(pcVar2[4] == -0x80);
        auVar16[5] = -(pcVar2[5] == -0x80);
        auVar16[6] = -(pcVar2[6] == -0x80);
        auVar16[7] = -(pcVar2[7] == -0x80);
        auVar16[8] = -(pcVar2[8] == -0x80);
        auVar16[9] = -(pcVar2[9] == -0x80);
        auVar16[10] = -(pcVar2[10] == -0x80);
        auVar16[0xb] = -(pcVar2[0xb] == -0x80);
        auVar16[0xc] = -(pcVar2[0xc] == -0x80);
        auVar16[0xd] = -(pcVar2[0xd] == -0x80);
        auVar16[0xe] = -(pcVar2[0xe] == -0x80);
        auVar16[0xf] = -(pcVar2[0xf] == -0x80);
        iVar12 = 3;
        if ((((((((((((((((auVar16 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar16 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar16 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar16 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar16 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar16 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar16 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar16 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar16 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar16 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar16 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar16 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar16 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar16 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar16 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar16[0xf]
           ) {
          lVar10 = uVar9 + lVar11;
          lVar11 = lVar11 + 0x10;
          uVar9 = lVar10 + 0x10U & uVar3;
          iVar12 = 0;
        }
      }
    } while (iVar12 == 0);
    if (iVar12 != 3) {
      prVar7 = this;
    }
  }
  return (size_t)prVar7;
}

Assistant:

size_t _find_key(const K& PHMAP_RESTRICT key, size_t hashval) {
        PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
            // ctrl_ could be nullptr
            if (!ctrl_)
                return (size_t)-1;
        }
        auto seq = probe(hashval);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            for (uint32_t i : g.Match((h2_t)H2(hashval))) {
                if (PHMAP_PREDICT_TRUE(PolicyTraits::apply(
                                          EqualElement<K>{key, eq_ref()},
                                          PolicyTraits::element(slots_ + seq.offset((size_t)i)))))
                    return seq.offset((size_t)i);
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) break;
            seq.next();
        }
        return (size_t)-1;
    }